

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HeaderStructs.cpp
# Opt level: O1

istream * operator>>(istream *stream,PicHeader *header)

{
  int iVar1;
  
  iVar1 = detectSwitch(stream);
  if (iVar1 < 0) {
    readPic<PicHeaderPS3>(stream,header);
  }
  else {
    readPic<PicHeaderSwitch>(stream,header);
  }
  return stream;
}

Assistant:

std::istream& operator>>(std::istream& stream, PicHeader& header) {
	int version = detectSwitch(stream);
	if (version < 0) { // PS3
		readPic<PicHeaderPS3>(stream, header);
	} else { // Switch
		readPic<PicHeaderSwitch>(stream, header);
	}
	return stream;
}